

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O2

cmServerResponse * __thiscall
cmServerProtocol1::ProcessCodeModel
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  cmake *pcVar1;
  cmGlobalGenerator *pcVar2;
  cmMakefile *this_00;
  _Base_ptr p_Var3;
  pointer pbVar4;
  pointer ppcVar5;
  bool bVar6;
  Value *pVVar7;
  const_reference ppcVar8;
  char *pcVar9;
  _Rb_tree_node_base *p_Var10;
  pointer ppcVar11;
  pointer value;
  _Base_ptr p_Var12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targetList;
  Value pObj;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> list;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> makefiles;
  Value local_170;
  Value local_148;
  Value result;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  if (this->m_State == STATE_COMPUTED) {
    Json::Value::Value(&result,objectValue);
    pcVar1 = (this->super_cmServerProtocol).m_CMakeInstance._M_t.
             super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
             super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
             super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
    Json::Value::Value(&local_170,arrayValue);
    local_248.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_248.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_248.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
              (&makefiles,&pcVar1->GlobalGenerator->Makefiles);
    if (makefiles.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        makefiles.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      cmMakefile::GetConfigurations
                ((string *)&list,
                 *makefiles.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                  super__Vector_impl_data._M_start,&local_248,true);
      std::__cxx11::string::~string((string *)&list);
      if (local_248.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_248.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string((string *)&pObj,"",(allocator *)&local_a8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pObj);
        std::__cxx11::string::~string((string *)&pObj);
      }
    }
    std::_Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~_Vector_base
              (&makefiles.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>);
    pbVar4 = local_248.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (value = local_248.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; value != pbVar4; value = value + 1) {
      Json::Value::Value(&local_148,objectValue);
      Json::Value::Value(&local_80,value);
      pVVar7 = Json::Value::operator[](&local_148,&kNAME_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar7,&local_80);
      Json::Value::~Value(&local_80);
      Json::Value::Value(&local_f8,arrayValue);
      pcVar2 = pcVar1->GlobalGenerator;
      p_Var10 = *(_Base_ptr *)((long)&(pcVar2->ProjectMap)._M_t + 0x18);
      while( true ) {
        if (p_Var10 == (_Rb_tree_node_base *)((long)&(pcVar2->ProjectMap)._M_t + 8U)) break;
        Json::Value::Value(&pObj,objectValue);
        Json::Value::Value((Value *)&makefiles,(string *)(p_Var10 + 1));
        pVVar7 = Json::Value::operator[](&pObj,&kNAME_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar7,(Value *)&makefiles);
        Json::Value::~Value((Value *)&makefiles);
        if (*(_Base_ptr *)(p_Var10 + 2) == p_Var10[2]._M_parent) {
          __assert_fail("!projectIt.second.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx"
                        ,0x3a7,"Json::Value DumpProjectList(const cmake *, const std::string &)");
        }
        ppcVar8 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::at
                            ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                             (p_Var10 + 2),0);
        this_00 = (*ppcVar8)->Makefile;
        pcVar9 = cmMakefile::GetCurrentSourceDirectory(this_00);
        Json::Value::Value(&local_a8,pcVar9);
        pVVar7 = Json::Value::operator[](&pObj,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar7,&local_a8);
        Json::Value::~Value(&local_a8);
        pcVar9 = cmMakefile::GetCurrentBinaryDirectory(this_00);
        Json::Value::Value(&local_58,pcVar9);
        pVVar7 = Json::Value::operator[](&pObj,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar7,&local_58);
        Json::Value::~Value(&local_58);
        Json::Value::Value(&local_d0,arrayValue);
        targetList.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        targetList.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        targetList.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        p_Var3 = p_Var10[2]._M_parent;
        for (p_Var12 = *(_Base_ptr *)(p_Var10 + 2); p_Var12 != p_Var3;
            p_Var12 = (_Base_ptr)&p_Var12->_M_parent) {
          std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                    (&list,(vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                           (*(long *)p_Var12 + 0x108));
          std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
          insert<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,void>
                    ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)&targetList,
                     (const_iterator)
                     targetList.
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                      )list.
                       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                      )list.
                       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::
          ~_Vector_base((_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                        &list);
        }
        std::
        __sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (targetList.
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   targetList.
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        ppcVar5 = targetList.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppcVar11 = targetList.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppcVar11 != ppcVar5;
            ppcVar11 = ppcVar11 + 1) {
          DumpTarget((Value *)&list,*ppcVar11,value);
          bVar6 = Json::Value::isNull((Value *)&list);
          if (!bVar6) {
            Json::Value::append(&local_d0,(Value *)&list);
          }
          Json::Value::~Value((Value *)&list);
        }
        std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
                  ((_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                   &targetList);
        pVVar7 = Json::Value::operator[](&pObj,&kTARGETS_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar7,&local_d0);
        Json::Value::~Value(&local_d0);
        Json::Value::append(&local_f8,&pObj);
        Json::Value::~Value(&pObj);
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      }
      pVVar7 = Json::Value::operator[](&local_148,&kPROJECTS_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar7,&local_f8);
      Json::Value::~Value(&local_f8);
      Json::Value::append(&local_170,&local_148);
      Json::Value::~Value(&local_148);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_248);
    pVVar7 = Json::Value::operator[](&result,&kCONFIGURATIONS_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar7,&local_170);
    Json::Value::~Value(&local_170);
    cmServerRequest::Reply(__return_storage_ptr__,request,&result);
    Json::Value::~Value(&result);
  }
  else {
    std::__cxx11::string::string
              ((string *)&list,"No build system was generated yet.",(allocator *)&pObj);
    cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&list);
    std::__cxx11::string::~string((string *)&list);
  }
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessCodeModel(
  const cmServerRequest& request)
{
  if (this->m_State != STATE_COMPUTED) {
    return request.ReportError("No build system was generated yet.");
  }

  Json::Value result = Json::objectValue;
  result[kCONFIGURATIONS_KEY] = DumpConfigurationsList(this->CMakeInstance());
  return request.Reply(result);
}